

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void soul::SanityCheckPass::throwErrorIfMultidimensionalArray(Context *location,Type *type)

{
  bool bVar1;
  Structure *this;
  ArrayWithPreallocation<soul::Structure::Member,_8UL> *this_00;
  Member *pMVar2;
  char (*args) [25];
  Member *m;
  Member *__end3;
  Member *__begin3;
  ArrayWithPreallocation<soul::Structure::Member,_8UL> *__range3;
  CompileMessage local_68;
  undefined1 local_30 [8];
  Type elementType;
  Type *type_local;
  Context *location_local;
  
  elementType.structure.object = (Structure *)type;
  bVar1 = Type::isArray(type);
  if (bVar1) {
    Type::getArrayElementType((Type *)local_30,(Type *)elementType.structure.object);
    bVar1 = Type::isArray((Type *)local_30);
    if (bVar1) {
      Errors::notYetImplemented<char_const(&)[25]>
                (&local_68,(Errors *)"Multi-dimensional arrays",args);
      AST::Context::throwError(location,&local_68,false);
    }
    throwErrorIfMultidimensionalArray(location,(Type *)local_30);
    Type::~Type((Type *)local_30);
  }
  bVar1 = Type::isStruct((Type *)elementType.structure.object);
  if (bVar1) {
    this = Type::getStructRef(elementType.structure.object);
    this_00 = Structure::getMembers(this);
    __end3 = ArrayWithPreallocation<soul::Structure::Member,_8UL>::begin(this_00);
    pMVar2 = ArrayWithPreallocation<soul::Structure::Member,_8UL>::end(this_00);
    for (; __end3 != pMVar2; __end3 = __end3 + 1) {
      throwErrorIfMultidimensionalArray(location,&__end3->type);
    }
  }
  return;
}

Assistant:

static void throwErrorIfMultidimensionalArray (const AST::Context& location, const Type& type)
    {
        if (type.isArray())
        {
            auto elementType = type.getArrayElementType();

            if (elementType.isArray())
                location.throwError (Errors::notYetImplemented ("Multi-dimensional arrays"));

            throwErrorIfMultidimensionalArray (location, elementType);
        }

        if (type.isStruct())
            for (auto& m : type.getStructRef().getMembers())
                throwErrorIfMultidimensionalArray (location, m.type);
    }